

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void spr_write_booke206_mmucsr0(DisasContext_conflict10 *ctx,int sprn,int gprn)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGTemp *local_18;
  TCGv_i64 local_10;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  local_18 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_10 = (TCGv_i64)((long)&tcg_ctx->pool_cur + (long)cpu_gpr[gprn]);
  tcg_gen_callN_ppc64(tcg_ctx,helper_booke206_tlbflush_ppc64,(TCGTemp *)0x0,2,&local_18);
  return;
}

Assistant:

static void spr_write_booke206_mmucsr0(DisasContext *ctx, int sprn, int gprn)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    gen_helper_booke206_tlbflush(tcg_ctx, tcg_ctx->cpu_env, cpu_gpr[gprn]);
}